

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool CombinationKeyTest<Blob<160>,unsigned_int>
               (hashfunc<Blob<160>_> hash,int maxlen,uint *blocks,int blockcount,bool testColl,
               bool testDist,bool drawDiagram)

{
  bool bVar1;
  uint *key;
  undefined4 in_register_00000034;
  ulong uVar2;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_48;
  
  printf("Keyset \'Combination\' - up to %d blocks from a set of %d - ",
         CONCAT44(in_register_00000034,maxlen),(ulong)(uint)blockcount);
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < maxlen) {
    uVar2 = (long)maxlen * 4;
  }
  key = (uint *)operator_new__(uVar2);
  CombinationKeygenRecurse<Blob<160>,unsigned_int>
            (key,0,maxlen,blocks,blockcount,hash.m_hash,&local_48);
  operator_delete__(key);
  printf("%d keys\n",
         (ulong)(uint)((int)((ulong)((long)local_48.
                                           super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_48.
                                          super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x33333333));
  bVar1 = TestHashList<Blob<160>>(&local_48,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool CombinationKeyTest ( hashfunc<hashtype> hash, int maxlen, blocktype* blocks,
                          int blockcount, bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Combination' - up to %d blocks from a set of %d - ",maxlen,blockcount);

  //----------

  std::vector<hashtype> hashes;

  blocktype * key = new blocktype[maxlen];

  CombinationKeygenRecurse(key,0,maxlen,blocks,blockcount,hash,hashes);

  delete [] key;

  printf("%d keys\n",(int)hashes.size());

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}